

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void __thiscall libtorrent::aux::random_bytes(aux *this,span<char> buffer)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 local_18 [8];
  span<char> buffer_local;
  
  buffer_local.m_ptr = buffer.m_ptr;
  local_18 = (undefined1  [8])this;
  pcVar1 = span<char>::begin((span<char> *)local_18);
  pcVar2 = span<char>::end((span<char> *)local_18);
  ::std::generate<char*,libtorrent::aux::random_bytes(libtorrent::span<char>)::__0>(pcVar1,pcVar2);
  return;
}

Assistant:

void random_bytes(span<char> buffer)
		{
#ifdef TORRENT_BUILD_SIMULATOR
			// simulator
			for (auto& b : buffer) b = char(random(0xff));
#else
			std::generate(buffer.begin(), buffer.end(), [] { return char(random(0xff)); });
#endif
		}